

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

void Llb_MnnStop(Llb_Mnn_t *p)

{
  Vec_Ptr_t *p_00;
  long lVar1;
  DdNode *pDVar2;
  int iVar3;
  DdManager *pDVar4;
  double dVar5;
  double dVar6;
  
  if (p->pPars->fVerbose != 0) {
    pDVar4 = p->ddG;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeTran1 + p->timeTran2 + p->timeGloba);
    lVar1 = Cudd_ReadReorderingTime(pDVar4);
    p->timeReoG = lVar1;
    iVar3 = (int)pDVar4;
    Abc_Print(iVar3,"%s =","Image    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  build  ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeBuild * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)timeBuild / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  and-ex ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeAndEx * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)timeAndEx / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  other  ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)timeOther / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Transfer1");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeTran1 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran1 / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Transfer2");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeTran2 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran2 / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Global   ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeGloba * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeGloba / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Other    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","TOTAL    ");
    dVar6 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar6 * 100.0) / dVar6;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  reo    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  reoG   ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReoG * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeReoG / 1000000.0,dVar5);
  }
  pDVar2 = p->ddR->bFunc;
  if (pDVar2 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,pDVar2);
  }
  for (iVar3 = 0; p_00 = p->vRings, iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
    pDVar2 = (DdNode *)Vec_PtrEntry(p_00,iVar3);
    Cudd_RecursiveDeref(p->ddR,pDVar2);
  }
  Vec_PtrFree(p_00);
  pDVar4 = p->ddG;
  if (pDVar4->bFunc != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDVar4,pDVar4->bFunc);
    pDVar4 = p->ddG;
  }
  if (pDVar4->bFunc2 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDVar4,pDVar4->bFunc2);
    pDVar4 = p->ddG;
  }
  Extra_StopManager(pDVar4);
  Extra_StopManager(p->ddR);
  Vec_IntFreeP(&p->vCs2Glo);
  Vec_IntFreeP(&p->vNs2Glo);
  Vec_IntFreeP(&p->vGlo2Cs);
  Vec_IntFreeP(&p->vGlo2Ns);
  Vec_PtrFree(p->vLeaves);
  Vec_PtrFree(p->vRoots);
  if (p->pVars2Q != (int *)0x0) {
    free(p->pVars2Q);
    p->pVars2Q = (int *)0x0;
  }
  if (p->pOrderL != (int *)0x0) {
    free(p->pOrderL);
    p->pOrderL = (int *)0x0;
  }
  if (p->pOrderL2 != (int *)0x0) {
    free(p->pOrderL2);
    p->pOrderL2 = (int *)0x0;
  }
  free(p->pOrderG);
  free(p);
  return;
}

Assistant:

void Llb_MnnStop( Llb_Mnn_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeOther = p->timeTotal - p->timeImage - p->timeTran1 - p->timeTran2 - p->timeGloba;
        p->timeReoG  = Cudd_ReadReorderingTime(p->ddG);
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "  build  ",    timeBuild, p->timeTotal );
        ABC_PRTP( "  and-ex ",    timeAndEx, p->timeTotal );
        ABC_PRTP( "  other  ",    timeOther, p->timeTotal );
        ABC_PRTP( "Transfer1", p->timeTran1, p->timeTotal );
        ABC_PRTP( "Transfer2", p->timeTran2, p->timeTotal );
        ABC_PRTP( "Global   ", p->timeGloba, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
        ABC_PRTP( "  reoG   ", p->timeReoG,  p->timeTotal );
    }
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    if ( p->ddG->bFunc )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc );
    if ( p->ddG->bFunc2 )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
//    printf( "manager1\n" );
//    Extra_StopManager( p->dd );
//    printf( "manager2\n" );
    Extra_StopManager( p->ddG );
//    printf( "manager3\n" );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    Vec_PtrFree( p->vLeaves );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pVars2Q );
    ABC_FREE( p->pOrderL );
    ABC_FREE( p->pOrderL2 );
    ABC_FREE( p->pOrderG );
    ABC_FREE( p );
}